

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeAddOp3(Vdbe *p,int op,int p1,int p2,int p3)

{
  undefined1 *puVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined1 in_SIL;
  long in_RDI;
  undefined4 in_R8D;
  VdbeOp *pOp;
  int i;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = *(int *)(in_RDI + 0x90);
  if (local_4 < *(int *)(in_RDI + 0x94)) {
    *(int *)(in_RDI + 0x90) = *(int *)(in_RDI + 0x90) + 1;
    puVar1 = (undefined1 *)(*(long *)(in_RDI + 0x88) + (long)local_4 * 0x18);
    *puVar1 = in_SIL;
    *(undefined2 *)(puVar1 + 2) = 0;
    *(undefined4 *)(puVar1 + 4) = in_EDX;
    *(undefined4 *)(puVar1 + 8) = in_ECX;
    *(undefined4 *)(puVar1 + 0xc) = in_R8D;
    *(undefined8 *)(puVar1 + 0x10) = 0;
    puVar1[1] = 0;
  }
  else {
    local_4 = growOp3((Vdbe *)CONCAT44(local_4,in_stack_ffffffffffffffd8),-0x55555556,-0x55555556,
                      in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeAddOp3(Vdbe *p, int op, int p1, int p2, int p3){
  int i;
  VdbeOp *pOp;

  i = p->nOp;
  assert( p->eVdbeState==VDBE_INIT_STATE );
  assert( op>=0 && op<0xff );
  if( p->nOpAlloc<=i ){
    return growOp3(p, op, p1, p2, p3);
  }
  assert( p->aOp!=0 );
  p->nOp++;
  pOp = &p->aOp[i];
  assert( pOp!=0 );
  pOp->opcode = (u8)op;
  pOp->p5 = 0;
  pOp->p1 = p1;
  pOp->p2 = p2;
  pOp->p3 = p3;
  pOp->p4.p = 0;
  pOp->p4type = P4_NOTUSED;

  /* Replicate this logic in sqlite3VdbeAddOp4Int()
  ** vvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvv   */
#ifdef SQLITE_ENABLE_EXPLAIN_COMMENTS
  pOp->zComment = 0;
#endif
#if defined(SQLITE_ENABLE_STMT_SCANSTATUS) || defined(VDBE_PROFILE)
  pOp->nExec = 0;
  pOp->nCycle = 0;
#endif
#ifdef SQLITE_DEBUG
  if( p->db->flags & SQLITE_VdbeAddopTrace ){
    sqlite3VdbePrintOp(0, i, &p->aOp[i]);
    test_addop_breakpoint(i, &p->aOp[i]);
  }
#endif
#ifdef SQLITE_VDBE_COVERAGE
  pOp->iSrcLine = 0;
#endif
  /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^
  ** Replicate in sqlite3VdbeAddOp4Int() */

  return i;
}